

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::MemPass::GetPtr(MemPass *this,uint32_t ptrId,uint32_t *varId)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  Instruction *this_00;
  Instruction *this_01;
  Op OVar3;
  
  *varId = ptrId;
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
    ptrId = *varId;
  }
  this_00 = analysis::DefUseManager::GetDef
                      ((pIVar1->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,ptrId);
  OVar3 = this_00->opcode_;
  this_01 = this_00;
  if ((OVar3 != OpVariable) && (OVar3 != OpFunctionParameter)) {
    if (OVar3 == OpConstantNull) {
      *varId = 0;
      return this_00;
    }
    this_01 = Instruction::GetBaseAddress(this_00);
    OVar3 = this_01->opcode_;
  }
  uVar2 = 0;
  if ((OVar3 == OpVariable) && (uVar2 = 0, this_01->has_result_id_ == true)) {
    uVar2 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
  }
  *varId = uVar2;
  OVar3 = this_00->opcode_;
  while (OVar3 == OpCopyObject) {
    uVar2 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar2 = (uint)this_00->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(this_00,uVar2);
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    this_00 = analysis::DefUseManager::GetDef
                        ((pIVar1->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,uVar2);
    OVar3 = this_00->opcode_;
  }
  return this_00;
}

Assistant:

Instruction* MemPass::GetPtr(uint32_t ptrId, uint32_t* varId) {
  *varId = ptrId;
  Instruction* ptrInst = get_def_use_mgr()->GetDef(*varId);
  Instruction* varInst;

  if (ptrInst->opcode() == spv::Op::OpConstantNull) {
    *varId = 0;
    return ptrInst;
  }

  if (ptrInst->opcode() != spv::Op::OpVariable &&
      ptrInst->opcode() != spv::Op::OpFunctionParameter) {
    varInst = ptrInst->GetBaseAddress();
  } else {
    varInst = ptrInst;
  }
  if (varInst->opcode() == spv::Op::OpVariable) {
    *varId = varInst->result_id();
  } else {
    *varId = 0;
  }

  while (ptrInst->opcode() == spv::Op::OpCopyObject) {
    uint32_t temp = ptrInst->GetSingleWordInOperand(0);
    ptrInst = get_def_use_mgr()->GetDef(temp);
  }

  return ptrInst;
}